

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void display_feeling(_Bool obj_only)

{
  byte bVar1;
  uint uVar2;
  vault *pvVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  char *fmt;
  
  if ((player->opts).opt[0x24] != true) {
    return;
  }
  if (player->depth != 0) {
    if (player->themed_level == 0) {
      bVar1 = cave->feeling;
      uVar5 = bVar1 / 10;
      if (obj_only) {
        disturb(player);
        pcVar4 = obj_feeling_text[uVar5];
        fmt = "You feel that %s";
      }
      else {
        uVar2 = uVar5 * 0xfff6 + (uint)bVar1;
        if (z_info->feeling_need <= cave->feeling_squares) {
          uVar6 = 10;
          if (bVar1 < 0x6e) {
            uVar6 = uVar5;
          }
          uVar5 = 9;
          if ((uVar2 & 0xfffe) < 10) {
            uVar5 = uVar2;
          }
          pcVar4 = ", and";
          if ((byte)uVar6 < 7 != (ushort)uVar5 < 6) {
            pcVar4 = ", yet";
          }
          msg("%s%s %s",mon_feeling_text[uVar5 & 0xffff],pcVar4,obj_feeling_text[uVar6]);
          return;
        }
        pcVar4 = mon_feeling_text[uVar2 & 0xffff];
        fmt = "%s.";
      }
    }
    else {
      pvVar3 = themed_level((uint)player->themed_level);
      pcVar4 = pvVar3->typ;
      fmt = "%s";
    }
    msg(fmt,pcVar4);
    return;
  }
  msg("Looks like a typical town.");
  return;
}

Assistant:

void display_feeling(bool obj_only)
{
	uint16_t obj_feeling = cave->feeling / 10;
	uint16_t mon_feeling = cave->feeling - (10 * obj_feeling);
	const char *join;

	/* Don't show feelings for cold-hearted characters */
	if (!OPT(player, birth_feelings)) return;

	/* No useful feeling in town */
	if (!player->depth) {
		msg("Looks like a typical town.");
		return;
	}

	/* Special message for themed levels */
	if (player->themed_level) {
		struct vault *level = themed_level(player->themed_level);
		msg("%s", level->typ);
		return;
	}

	/* Display only the object feeling when it's first discovered. */
	if (obj_only) {
		disturb(player);
		msg("You feel that %s", obj_feeling_text[obj_feeling]);
		return;
	}

	/* Players automatically get a monster feeling. */
	if (cave->feeling_squares < z_info->feeling_need) {
		msg("%s.", mon_feeling_text[mon_feeling]);
		return;
	}

	/* Verify the feelings */
	if (obj_feeling >= N_ELEMENTS(obj_feeling_text))
		obj_feeling = N_ELEMENTS(obj_feeling_text) - 1;

	if (mon_feeling >= N_ELEMENTS(mon_feeling_text))
		mon_feeling = N_ELEMENTS(mon_feeling_text) - 1;

	/* Decide the conjunction */
	if ((mon_feeling <= 5 && obj_feeling > 6) ||
			(mon_feeling > 5 && obj_feeling <= 6))
		join = ", yet";
	else
		join = ", and";

	/* Display the feeling */
	msg("%s%s %s", mon_feeling_text[mon_feeling], join,
		obj_feeling_text[obj_feeling]);
}